

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_iterator.hpp
# Opt level: O0

bool __thiscall
boost::unit_test::utils::
basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>::
get(basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>
    *this)

{
  byte bVar1;
  basic_cstring<const_char> *l;
  long in_RDI;
  bool res;
  iterator begin;
  char *in_stack_ffffffffffffffd8;
  char **in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  basic_cstring<const_char> *this_00;
  
  l = (basic_cstring<const_char> *)
      basic_cstring<const_char>::begin((basic_cstring<const_char> *)(in_RDI + 0x60));
  basic_cstring<const_char>::end((basic_cstring<const_char> *)(in_RDI + 0x60));
  bVar1 = token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,boost::unit_test::utils::ut_detail::default_char_compare<char>>,char,boost::unit_test::utils::ut_detail::default_char_compare<char>,boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>,boost::iterators::forward_traversal_tag>
          ::get<char_const*>((token_iterator_base<boost::unit_test::utils::basic_string_token_iterator<char,_boost::unit_test::utils::ut_detail::default_char_compare<char>_>,_char,_boost::unit_test::utils::ut_detail::default_char_compare<char>,_boost::unit_test::basic_cstring<const_char>,_boost::unit_test::basic_cstring<const_char>,_boost::iterators::forward_traversal_tag>
                              *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),
                             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = l;
  basic_cstring<const_char>::end((basic_cstring<const_char> *)(in_RDI + 0x60));
  basic_cstring<const_char>::assign
            (this_00,(pointer)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(pointer)l);
  return (bool)(bVar1 & 1);
}

Assistant:

bool        get()
    {
        typename cstring::iterator begin = m_src.begin();
        bool res = base::get( begin, m_src.end() );

        m_src.assign( begin, m_src.end() );

        return res;
    }